

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

UntypedActionResultHolderBase * __thiscall
testing::internal::FunctionMockerBase<BasicTestLinearExprBuilder<1>_(int)>::UntypedPerformAction
          (FunctionMockerBase<BasicTestLinearExprBuilder<1>_(int)> *this,void *untyped_action,
          void *untyped_args)

{
  ActionResultHolder<BasicTestLinearExprBuilder<1>_> *pAVar1;
  Action<BasicTestLinearExprBuilder<1>_(int)> *in_RDX;
  ArgumentTuple *args;
  Action<BasicTestLinearExprBuilder<1>_(int)> action;
  Action<BasicTestLinearExprBuilder<1>_(int)> *in_stack_ffffffffffffffa8;
  ArgumentTuple *in_stack_ffffffffffffffc8;
  Action<BasicTestLinearExprBuilder<1>_(int)> local_28;
  Action<BasicTestLinearExprBuilder<1>_(int)> *local_18;
  
  local_18 = in_RDX;
  Action<BasicTestLinearExprBuilder<1>_(int)>::Action(&local_28,in_stack_ffffffffffffffa8);
  pAVar1 = ActionResultHolder<BasicTestLinearExprBuilder<1>>::
           PerformAction<BasicTestLinearExprBuilder<1>(int)>(local_18,in_stack_ffffffffffffffc8);
  Action<BasicTestLinearExprBuilder<1>_(int)>::~Action
            ((Action<BasicTestLinearExprBuilder<1>_(int)> *)0x1de521);
  return &pAVar1->super_UntypedActionResultHolderBase;
}

Assistant:

virtual UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, const void* untyped_args) const {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, args);
  }